

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pose.cpp
# Opt level: O3

void __thiscall Pose::setrot(Pose *this,double RX,double RY,double RZ)

{
  CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *pCVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double w;
  double z;
  double y;
  double local_40;
  double local_38;
  CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> local_30;
  double local_10;
  
  dVar2 = cos(RZ * 0.5);
  dVar3 = sin(RZ * 0.5);
  dVar4 = cos(RY * 0.5);
  dVar5 = sin(RY * 0.5);
  dVar6 = cos(RX * 0.5);
  dVar7 = sin(RX * 0.5);
  local_10 = dVar5 * dVar6 * dVar2 + dVar3 * dVar4 * dVar7;
  local_38 = dVar4 * dVar6 * dVar3 - dVar2 * dVar5 * dVar7;
  local_40 = dVar4 * dVar6 * dVar2 + dVar5 * dVar7 * dVar3;
  local_30.m_xpr = &this->rot;
  local_30.m_row = 0;
  local_30.m_col = 1;
  local_30.m_currentBlockRows = 1;
  (this->rot).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0]
       = dVar4 * dVar7 * dVar2 - dVar3 * dVar5 * dVar6;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_
                     (&local_30,&local_10);
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_
                     (pCVar1,&local_38);
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_(pCVar1,&local_40);
  if ((local_30.m_currentBlockRows + local_30.m_row == 4) && (local_30.m_col == 1)) {
    return;
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 4, 1>>::finished() [MatrixType = Eigen::Matrix<double, 4, 1>]"
               );
}

Assistant:

void Pose::setrot(double RX, double RY, double RZ){
      double x, y, z, w;
      // Abbreviations for the various angular functions
      double cy = cos(RZ * 0.5);
      double sy = sin(RZ * 0.5);
      double cp = cos(RY * 0.5);
      double sp = sin(RY * 0.5);
      double cr = cos(RX * 0.5);
      double sr = sin(RX * 0.5);

      x = sr * cp * cy - cr * sp * sy;
      y = cr * sp * cy + sr * cp * sy;
      z = cr * cp * sy - sr * sp * cy;
      w = cr * cp * cy + sr * sp * sy;

      this->rot << x, y, z, w;
}